

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O1

int cfg_validate_netaddr
              (autobuf *out,char *section_name,char *entry_name,char *value,_Bool prefix,
              int8_t *af_types,size_t af_types_count)

{
  byte bVar1;
  int iVar2;
  char *fmt;
  size_t sVar3;
  netaddr local_42;
  
  iVar2 = netaddr_from_string(&local_42,value);
  if (iVar2 == 0) {
    bVar1 = netaddr_get_af_maxprefix((uint)local_42._type);
    if (bVar1 < local_42._prefix_len) {
      fmt = "Value \'%s\' for entry \'%s\' in section %s has an illegal prefix length";
    }
    else if (local_42._prefix_len == bVar1 || prefix) {
      fmt = "Value \'%s\' for entry \'%s\' in section \'%s\' is wrong address type";
      if (af_types_count != 0) {
        sVar3 = 0;
        do {
          if ((int)af_types[sVar3] == (uint)local_42._type) {
            return 0;
          }
          sVar3 = sVar3 + 1;
        } while (af_types_count != sVar3);
      }
    }
    else {
      fmt = "Value \'%s\' for entry \'%s\' in section %s must be a single address, not a prefix";
    }
  }
  else {
    fmt = "Value \'%s\' for entry \'%s\' in section %s is no valid network address";
  }
  cfg_append_printable_line(out,fmt,value,entry_name,section_name);
  return -1;
}

Assistant:

int
cfg_validate_netaddr(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  bool prefix, const int8_t *af_types, size_t af_types_count) {
  struct netaddr addr;
  uint8_t max_prefix;
  size_t i;

  if (netaddr_from_string(&addr, value)) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s is no valid network address",
      value, entry_name, section_name);
    return -1;
  }

  max_prefix = netaddr_get_maxprefix(&addr);

  /* check prefix length */
  if (netaddr_get_prefix_length(&addr) > max_prefix) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s has an illegal prefix length",
      value, entry_name, section_name);
    return -1;
  }
  if (!prefix && netaddr_get_prefix_length(&addr) != max_prefix) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s must be a single address, not a prefix",
      value, entry_name, section_name);
    return -1;
  }

  for (i = 0; i < af_types_count; i++) {
    if (af_types[i] == netaddr_get_address_family(&addr)) {
      return 0;
    }
  }

  /* at least one condition was set, but no one matched */
  cfg_append_printable_line(out,
    "Value '%s' for entry '%s'"
    " in section '%s' is wrong address type",
    value, entry_name, section_name);
  return -1;
}